

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

int ON_4dPoint::ProjectiveCompare(ON_4dPoint *lhs,ON_4dPoint *rhs)

{
  double dVar1;
  double dVar2;
  int iVar3;
  ON_3dPoint OStack_48;
  ON_3dPoint local_30;
  
  dVar1 = lhs->w;
  dVar2 = rhs->w;
  if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
LAB_00576e3b:
    iVar3 = Internal_DoubleArrayCompare(3,&lhs->x,&rhs->x);
    return iVar3;
  }
  if (((dVar1 == 0.0) && (!NAN(dVar1))) || ((dVar2 == 0.0 && (!NAN(dVar2))))) {
    iVar3 = -1;
    if (((dVar1 == 0.0) && (!NAN(dVar1))) || ((dVar2 != 0.0 || (NAN(dVar2))))) {
      if (((dVar1 != 0.0) || (NAN(dVar1))) || ((dVar2 == 0.0 && (!NAN(dVar2))))) {
        if ((NAN(dVar1)) && (iVar3 = 1, NAN(dVar2))) goto LAB_00576e3b;
      }
      else {
        iVar3 = 1;
      }
    }
  }
  else {
    ON_3dPoint::ON_3dPoint(&local_30,lhs);
    ON_3dPoint::ON_3dPoint(&OStack_48,rhs);
    iVar3 = Internal_DoubleArrayCompare(3,&local_30.x,&OStack_48.x);
  }
  return iVar3;
}

Assistant:

int ON_4dPoint::ProjectiveCompare(
  const ON_4dPoint& lhs,
  const ON_4dPoint& rhs
  )
{
  if (lhs.w == rhs.w)
  {
    // neither lhs.w nor rhs.w is a nan
    return Internal_DoubleArrayCompare(3, &lhs.x, &rhs.x);
  }

  if (0.0 != lhs.w && 0.0 != rhs.w)
  {
    // neither lhs.w nor rhs.w is a nan
    return ON_3dPoint::Compare(ON_3dPoint(lhs), ON_3dPoint(rhs));
  }

  if (0.0 != lhs.w && 0.0 == rhs.w)
  {
    // neither lhs.w nor rhs.w is a nan
    return -1;
  }

  if (0.0 == lhs.w && 0.0 != rhs.w)
  {
    // neither lhs.w nor rhs.w is a nan
    return 1;
  }

  if (lhs.w == lhs.w)
  {
    // rhs.w is a nan
    return -1; 
  }

  if (rhs.w == rhs.w)
  {
    // lhs.w is a nan
    return 1; 
  }

  // lhs.w and rhs.w are both nans
  return Internal_DoubleArrayCompare(3, &lhs.x, &rhs.x);
}